

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

void fct_dotted_line_start(size_t maxwidth,char *startwith)

{
  size_t sVar1;
  size_t __n;
  char line [256];
  
  builtin_strncpy(line,"....................................................................",0x44);
  sVar1 = strlen((char *)maxwidth);
  __n = 0x43;
  if (sVar1 < 0x43) {
    __n = sVar1;
  }
  memcpy(line,(void *)maxwidth,__n);
  if (sVar1 < 0x43) {
    line[sVar1] = ' ';
  }
  line._64_4_ = line._64_4_ & 0xffffff;
  fputs(line,_stdout);
  return;
}

Assistant:

static void
fct_dotted_line_start(size_t maxwidth, char const *startwith)
{
    char line[FCT_DOTTED_MAX_LEN];
    size_t len =0;
    size_t line_len =0;

    memset(line, '.', sizeof(char)*maxwidth);
    len = strlen(startwith);
    line_len = FCTMIN(maxwidth-1, len);
    memcpy(line, startwith, sizeof(char)*line_len);
    if ( len < maxwidth-1)
    {
        line[len] = ' ';
    }
    line[maxwidth-1] = '\0';
    fputs(line, stdout);
}